

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curltest.c
# Opt level: O0

int GetWebFiles(char *url1,char *url2)

{
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *pcVar4;
  CURL_conflict *data;
  int local_43c;
  char local_438 [4];
  int proxy_type;
  char proxy [1024];
  CURLcode res;
  CURL *curl;
  int retVal;
  char *url2_local;
  char *url1_local;
  
  local_43c = 0;
  pcVar3 = getenv("HTTP_PROXY");
  if (pcVar3 != (char *)0x0) {
    local_43c = 1;
    pcVar3 = getenv("HTTP_PROXY_PORT");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = getenv("HTTP_PROXY");
      sprintf(local_438,"%s",pcVar3);
    }
    else {
      pcVar3 = getenv("HTTP_PROXY");
      pcVar4 = getenv("HTTP_PROXY_PORT");
      sprintf(local_438,"%s:%s",pcVar3,pcVar4);
    }
    pcVar3 = getenv("HTTP_PROXY_TYPE");
    if (pcVar3 != (char *)0x0) {
      pcVar3 = getenv("HTTP_PROXY_TYPE");
      iVar1 = strcmp(pcVar3,"HTTP");
      if (iVar1 == 0) {
        local_43c = 1;
      }
      else {
        pcVar3 = getenv("HTTP_PROXY_TYPE");
        iVar1 = strcmp(pcVar3,"SOCKS4");
        if (iVar1 == 0) {
          local_43c = 2;
        }
        else {
          pcVar3 = getenv("HTTP_PROXY_TYPE");
          iVar1 = strcmp(pcVar3,"SOCKS5");
          if (iVar1 == 0) {
            local_43c = 3;
          }
        }
      }
    }
  }
  data = curl_easy_init();
  if (data == (CURL_conflict *)0x0) {
    printf("Cannot create curl object\n");
    curl._4_4_ = 1;
  }
  else {
    curl_easy_setopt(data,CURLOPT_VERBOSE,1);
    curl_easy_setopt(data,CURLOPT_HEADER,1);
    if (local_43c != 0) {
      curl_easy_setopt(data,CURLOPT_PROXY,local_438);
      if (local_43c == 2) {
        curl_easy_setopt(data,CURLOPT_PROXYTYPE,4);
      }
      else if (local_43c == 3) {
        curl_easy_setopt(data,CURLOPT_PROXYTYPE,5);
      }
      else {
        curl_easy_setopt(data,CURLOPT_PROXYTYPE,0);
      }
    }
    curl_easy_setopt(data,CURLOPT_URL,url1);
    CVar2 = curl_easy_perform(data);
    if (CVar2 != CURLE_OK) {
      printf("Error fetching: %s\n",url1);
    }
    curl._4_4_ = (uint)(CVar2 != CURLE_OK);
    curl_easy_cleanup(data);
  }
  return curl._4_4_;
}

Assistant:

int GetWebFiles(char *url1, char *url2)
{
  int retVal = 0;
  CURL *curl;
  CURLcode res;

  char proxy[1024];
  int proxy_type = 0;

  if ( getenv("HTTP_PROXY") )
    {
    proxy_type = 1;
    if (getenv("HTTP_PROXY_PORT") )
      {
      sprintf(proxy, "%s:%s", getenv("HTTP_PROXY"), getenv("HTTP_PROXY_PORT"));
      }
    else
      {
      sprintf(proxy, "%s", getenv("HTTP_PROXY"));
      }
    if ( getenv("HTTP_PROXY_TYPE") )
      {
      /* HTTP/SOCKS4/SOCKS5 */
      if ( strcmp(getenv("HTTP_PROXY_TYPE"), "HTTP") == 0 )
        {
        proxy_type = 1;
        }
      else if ( strcmp(getenv("HTTP_PROXY_TYPE"), "SOCKS4") == 0 )
        {
        proxy_type = 2;
        }
      else if ( strcmp(getenv("HTTP_PROXY_TYPE"), "SOCKS5") == 0 )
        {
        proxy_type = 3;
        }
      }
    }

  curl = curl_easy_init();
  if(curl) 
    {
    curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    curl_easy_setopt(curl, CURLOPT_HEADER, 1);

    /* Using proxy */
    if ( proxy_type > 0 )
      {
      curl_easy_setopt(curl, CURLOPT_PROXY, proxy); 
      switch (proxy_type)
        {
        case 2:
          curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
          break;
        case 3:
          curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
          break;
        default:
          curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);           
        }
      }

    /* get the first document */
    curl_easy_setopt(curl, CURLOPT_URL, url1);
    res = curl_easy_perform(curl);
    if ( res != 0 )
      {
      printf("Error fetching: %s\n", url1);
      retVal = 1;
      }

    /* get another document from the same server using the same
       connection */
    /* avoid warnings about url2 since below block is commented out: */
    (void) url2;
    /*
      curl_easy_setopt(curl, CURLOPT_URL, url2);
      res = curl_easy_perform(curl);
      if ( res != 0 )
      {
      printf("Error fetching: %s\n", url2);
      retVal = 1;
      }
    */

    /* always cleanup */
    curl_easy_cleanup(curl);
    }
  else
    {
    printf("Cannot create curl object\n");
    retVal = 1;
    }

  return retVal;
}